

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceStatement
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int path2;
  ServiceOptions *options;
  MethodDescriptorProto *method;
  undefined1 local_60 [8];
  LocationRecorder location_1;
  undefined1 local_40 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *service_location_local;
  ServiceDescriptorProto *service_local;
  Parser *this_local;
  
  location.location_ = (Location *)containing_file;
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = LookingAt(this,"option");
    if (bVar1) {
      LocationRecorder::LocationRecorder((LocationRecorder *)local_40,service_location,3);
      options = ServiceDescriptorProto::mutable_options(service);
      this_local._7_1_ =
           ParseOption(this,&options->super_Message,(LocationRecorder *)local_40,
                       (FileDescriptorProto *)location.location_,OPTION_STATEMENT);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_40);
    }
    else {
      path2 = ServiceDescriptorProto::method_size(service);
      LocationRecorder::LocationRecorder((LocationRecorder *)local_60,service_location,2,path2);
      method = ServiceDescriptorProto::add_method(service);
      this_local._7_1_ =
           ParseServiceMethod(this,method,(LocationRecorder *)local_60,
                              (FileDescriptorProto *)location.location_);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_60);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseServiceStatement(ServiceDescriptorProto* service,
                                   const LocationRecorder& service_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(
        service_location, ServiceDescriptorProto::kOptionsFieldNumber);
    return ParseOption(service->mutable_options(), location,
                       containing_file, OPTION_STATEMENT);
  } else {
    LocationRecorder location(service_location,
        ServiceDescriptorProto::kMethodFieldNumber, service->method_size());
    return ParseServiceMethod(service->add_method(), location, containing_file);
  }
}